

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::InterpolateBoundary>
               (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                *input,Property *output,string *err)

{
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *this;
  TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary> *ts_00;
  AttrMeta *pAVar3;
  AttrMeta *this_00;
  InterpolateBoundary v_00;
  Property local_9a8;
  int local_3c4;
  undefined1 local_3c0 [8];
  Value val;
  undefined1 local_388 [8];
  token tok;
  undefined1 local_360 [4];
  InterpolateBoundary a;
  TimeSamples ts;
  PrimVar pvar;
  Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *v;
  string local_2f0;
  undefined1 local_2d0 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
  *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2d0);
  pVVar2 = Attribute::variability((Attribute *)local_2d0);
  *pVVar2 = Varying;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2f0,"token",(allocator *)((long)&v + 7));
  Attribute::set_type_name((Attribute *)local_2d0,&local_2f0);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
          ::is_blocked(input);
  if (bVar1) {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
            ::is_blocked(input);
    Attribute::set_blocked((Attribute *)local_2d0,bVar1);
  }
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
          ::has_connections(input);
  if (bVar1) {
    paths = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
            ::get_connections(input);
    Attribute::set_connections((Attribute *)local_2d0,paths);
  }
  this = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
         ::get_value(input);
  primvar::PrimVar::PrimVar((PrimVar *)&ts._dirty);
  bVar1 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_timesamples(this);
  if (bVar1) {
    ts_00 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::get_timesamples(this);
    EnumTimeSamplesToTypelessTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>
              ((TimeSamples *)local_360,ts_00);
    primvar::PrimVar::set_timesamples((PrimVar *)&ts._dirty,(TimeSamples *)local_360);
    tinyusdz::value::TimeSamples::~TimeSamples((TimeSamples *)local_360);
  }
  bVar1 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_default(this);
  if (bVar1) {
    bVar1 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::get_default
                      (this,(InterpolateBoundary *)(tok.str_.field_2._M_local_buf + 0xc));
    if (!bVar1) {
      if (attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "[InternalError] Invalid Animatable value.");
      }
      input_local._7_1_ = 0;
      local_3c4 = 1;
      goto LAB_007e4966;
    }
    tinyusdz::to_string_abi_cxx11_
              ((string *)&val.v_.vtable,(tinyusdz *)(ulong)(uint)tok.str_.field_2._12_4_,v_00);
    Token::Token((Token *)local_388,(string *)&val.v_.vtable);
    ::std::__cxx11::string::~string((string *)&val.v_.vtable);
    tinyusdz::value::Value::Value<tinyusdz::Token>((Value *)local_3c0,(Token *)local_388);
    primvar::PrimVar::set_value<tinyusdz::value::Value>((PrimVar *)&ts._dirty,(Value *)local_3c0);
    tinyusdz::value::Value::~Value((Value *)local_3c0);
    Token::~Token((Token *)local_388);
  }
  bVar1 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_timesamples(this);
  if ((bVar1) ||
     (bVar1 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_default(this), bVar1)) {
    Attribute::set_var((Attribute *)local_2d0,(PrimVar *)&ts._dirty);
  }
  local_3c4 = 0;
LAB_007e4966:
  primvar::PrimVar::~PrimVar((PrimVar *)&ts._dirty);
  if (local_3c4 == 0) {
    pAVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
             ::metas(input);
    this_00 = Attribute::metas((Attribute *)local_2d0);
    AttrMetas::operator=(this_00,pAVar3);
    Property::Property(&local_9a8,(Attribute *)local_2d0,false);
    Property::operator=(output,&local_9a8);
    Property::~Property(&local_9a8);
    input_local._7_1_ = 1;
    local_3c4 = 1;
  }
  Attribute::~Attribute((Attribute *)local_2d0);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool ToTokenProperty(const TypedAttributeWithFallback<Animatable<T>> &input,
                     Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::kToken);
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::kToken);
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      if (err) {
        (*err) += "Empty targetPaths.";
      }
      return false;
    }
    if (pv.size() == 1) {
      output = Property(pv[0], /* type */ value::kToken, /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::kToken, /* custom */ false);
    } else {
      if (err) {
        (*err) += "[InternalError] Invalid targetPaths.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_timesamples()) {
      value::TimeSamples ts =
          EnumTimeSamplesToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    } else if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        // to token type
        value::token tok(to_string(a));
        value::Value val(tok);
        pvar.set_value(val);
      } else {
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    } else {
      if (err) {
        (*err) += "[InternalError] Invalid Animatable value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Varying;
    output = Property(attr, /* custom */ false);
  }
#else

  Attribute attr;
  attr.variability() = Variability::Varying;
  attr.set_type_name(value::kToken);

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    const Animatable<T> &v = input.get_value();

    primvar::PrimVar pvar;

    if (v.has_timesamples()) {
      value::TimeSamples ts =
          EnumTimeSamplesToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    }

    if (v.has_default()) {
      T a;
      if (v.get_default(&a)) {
        // to token type
        value::token tok(to_string(a));
        value::Value val(tok);
        pvar.set_value(val);
      } else {
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    }

    if (v.has_timesamples() || v.has_default()) {
      attr.set_var(std::move(pvar));
    }

  }

  attr.metas() = input.metas();

  output = Property(attr, /* custom */ false);
#endif

  return true;
}